

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_resampler_set_rate
                    (ma_resampler *pResampler,ma_uint32 sampleRateIn,ma_uint32 sampleRateOut)

{
  _func_ma_result_void_ptr_ma_resampling_backend_ptr_ma_uint32_ma_uint32 *p_Var1;
  ma_result mVar2;
  
  mVar2 = MA_INVALID_ARGS;
  if ((pResampler != (ma_resampler *)0x0) &&
     (mVar2 = MA_INVALID_ARGS, sampleRateOut != 0 && sampleRateIn != 0)) {
    mVar2 = MA_NOT_IMPLEMENTED;
    if ((pResampler->pBackendVTable != (ma_resampling_backend_vtable *)0x0) &&
       ((p_Var1 = pResampler->pBackendVTable->onSetRate,
        p_Var1 != (_func_ma_result_void_ptr_ma_resampling_backend_ptr_ma_uint32_ma_uint32 *)0x0 &&
        (mVar2 = (*p_Var1)(pResampler->pBackendUserData,pResampler->pBackend,sampleRateIn,
                           sampleRateOut), mVar2 == MA_SUCCESS)))) {
      pResampler->sampleRateIn = sampleRateIn;
      pResampler->sampleRateOut = sampleRateOut;
      mVar2 = MA_SUCCESS;
    }
  }
  return mVar2;
}

Assistant:

MA_API ma_result ma_resampler_set_rate(ma_resampler* pResampler, ma_uint32 sampleRateIn, ma_uint32 sampleRateOut)
{
    ma_result result;

    if (pResampler == NULL) {
        return MA_INVALID_ARGS;
    }

    if (sampleRateIn == 0 || sampleRateOut == 0) {
        return MA_INVALID_ARGS;
    }

    if (pResampler->pBackendVTable == NULL || pResampler->pBackendVTable->onSetRate == NULL) {
        return MA_NOT_IMPLEMENTED;
    }

    result = pResampler->pBackendVTable->onSetRate(pResampler->pBackendUserData, pResampler->pBackend, sampleRateIn, sampleRateOut);
    if (result != MA_SUCCESS) {
        return result;
    }

    pResampler->sampleRateIn  = sampleRateIn;
    pResampler->sampleRateOut = sampleRateOut;

    return MA_SUCCESS;
}